

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void change_inline_insn_regs(MIR_context_t ctx,MIR_insn_t_conflict new_insn)

{
  char cVar1;
  VARR_MIR_reg_t *pVVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (new_insn == (MIR_insn_t_conflict)0x0) {
LAB_001434bd:
    __assert_fail("insn != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
  }
  uVar3 = *(ulong *)&new_insn->field_0x18 >> 0x20;
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      cVar1 = (&new_insn->ops[0].field_0x8)[lVar4];
      if (cVar1 == '\n') {
        uVar5 = (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar4 + 0x10);
        if (uVar5 != 0) {
          pVVar2 = ctx->simplify_ctx->inline_reg_map;
          if (((pVVar2 == (VARR_MIR_reg_t *)0x0) || (pVVar2->varr == (MIR_reg_t *)0x0)) ||
             (pVVar2->els_num <= uVar5)) goto LAB_001434b3;
          *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar4 + 0x10) = pVVar2->varr[uVar5];
        }
        uVar5 = (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar4 + 0x14);
        if (uVar5 != 0) {
          pVVar2 = ctx->simplify_ctx->inline_reg_map;
          if (((pVVar2 == (VARR_MIR_reg_t *)0x0) || (pVVar2->varr == (MIR_reg_t *)0x0)) ||
             (pVVar2->els_num <= uVar5)) goto LAB_001434b8;
          *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar4 + 0x14) = pVVar2->varr[uVar5];
        }
      }
      else if (cVar1 == '\x01') {
        pVVar2 = ctx->simplify_ctx->inline_reg_map;
        if (((pVVar2 == (VARR_MIR_reg_t *)0x0) || (pVVar2->varr == (MIR_reg_t *)0x0)) ||
           (uVar5 = (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar4), pVVar2->els_num <= uVar5))
        {
          change_inline_insn_regs_cold_3();
LAB_001434b3:
          change_inline_insn_regs_cold_1();
LAB_001434b8:
          change_inline_insn_regs_cold_2();
          goto LAB_001434bd;
        }
        *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar4) = pVVar2->varr[uVar5];
      }
      lVar4 = lVar4 + 0x30;
    } while (uVar3 * 0x30 != lVar4);
  }
  return;
}

Assistant:

static void change_inline_insn_regs (MIR_context_t ctx, MIR_insn_t new_insn) {
  size_t i, actual_nops;
  actual_nops = MIR_insn_nops (ctx, new_insn);
  for (i = 0; i < actual_nops; i++) {
    switch (new_insn->ops[i].mode) {
    case MIR_OP_REG:
      new_insn->ops[i].u.reg = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.reg);
      break;
    case MIR_OP_MEM:
      if (new_insn->ops[i].u.mem.base != 0)
        new_insn->ops[i].u.mem.base
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.base);
      if (new_insn->ops[i].u.mem.index != 0)
        new_insn->ops[i].u.mem.index
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.index);
      break;
    default: /* do nothing */ break;
    }
  }
}